

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O2

void __thiscall helics::udp::UdpComms::closeReceiver(UdpComms *this)

{
  string *__lhs;
  long lVar1;
  bool bVar2;
  long lVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view message;
  string_view fmt;
  format_args args;
  string local_1a8;
  shared_ptr<gmlc::networking::AsioContextManager> serv;
  error_code error;
  endpoint rxEndpoint;
  string local_148;
  string cls;
  undefined8 local_d8;
  __uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_> _Stack_d0;
  socket transmitter;
  
  if ((this->super_NetworkCommsInterface).super_CommsInterface.txStatus._M_i == CONNECTED) {
    ActionMessage::ActionMessage((ActionMessage *)&transmitter,cmd_protocol);
    transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.service_ =
         (service_type *)
         CONCAT44(0x16570bf,
                  transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                  service_._0_4_);
    CommsInterface::transmit
              ((CommsInterface *)this,(route_id)0xffffffff,(ActionMessage *)&transmitter);
    ActionMessage::~ActionMessage((ActionMessage *)&transmitter);
    return;
  }
  if (((this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i & 1U) !=
      0) {
    return;
  }
  transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.service_ =
       (service_type *)
       &transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
        super_base_implementation_type.reactor_data_;
  transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.socket_ = 0;
  transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.state_ = '\0';
  transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type._5_3_ = 0;
  transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.reactor_data_._0_1_ = 0;
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)&serv,(string *)&transmitter);
  std::__cxx11::string::~string((string *)&transmitter);
  if (serv.super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) goto LAB_0020b310;
  rxEndpoint.impl_.data_.v6.sin6_scope_id = 0;
  rxEndpoint.impl_.data_._8_1_ = '\0';
  rxEndpoint.impl_.data_._9_1_ = '\0';
  rxEndpoint.impl_.data_._10_1_ = '\0';
  rxEndpoint.impl_.data_._11_1_ = '\0';
  rxEndpoint.impl_.data_._12_1_ = '\0';
  rxEndpoint.impl_.data_._13_1_ = '\0';
  rxEndpoint.impl_.data_._14_1_ = '\0';
  rxEndpoint.impl_.data_._15_1_ = '\0';
  rxEndpoint.impl_.data_._16_8_ = 0;
  rxEndpoint.impl_.data_._0_8_ = 2;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress._M_string_length
      == 0) {
LAB_0020b0ec:
    asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::basic_resolver<asio::io_context>
              ((basic_resolver<asio::ip::udp,_asio::any_io_executor> *)&cls,
               ((serv.
                 super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->ictx)._M_t.
               super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
               super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
               super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,0);
    local_d8 = CONCAT44(local_d8._4_4_,
                        (uint)((this->super_NetworkCommsInterface).super_CommsInterface.
                               interfaceNetwork == IPV6) * 8 + 2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"127.0.0.1",(allocator<char> *)&error);
    CLI::std::__cxx11::to_string
              (&local_148,
               (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i);
    asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)&transmitter,(protocol_type *)&local_d8,
               &local_1a8,(string *)&local_148,address_configured);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_1a8);
    asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
              ((results_type *)&local_1a8,
               (basic_resolver<asio::ip::udp,_asio::any_io_executor> *)&cls,(query *)&transmitter);
  }
  else {
    __lhs = &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,"*");
    if ((bVar2) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"udp://*"), bVar2)) goto LAB_0020b0ec;
    asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::basic_resolver<asio::io_context>
              ((basic_resolver<asio::ip::udp,_asio::any_io_executor> *)&cls,
               ((serv.
                 super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->ictx)._M_t.
               super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
               super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
               super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,0);
    local_148._M_dataplus._M_p._0_4_ =
         (uint)((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) *
         8 + 2;
    CLI::std::__cxx11::to_string
              ((string *)&local_1a8,
               (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i);
    asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)&transmitter,(protocol_type *)&local_148,__lhs
               ,&local_1a8,address_configured);
    std::__cxx11::string::~string((string *)&local_1a8);
    asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
              ((results_type *)&local_1a8,
               (basic_resolver<asio::ip::udp,_asio::any_io_executor> *)&cls,(query *)&transmitter);
  }
  lVar1 = *(long *)local_1a8._M_dataplus._M_p;
  lVar3 = local_1a8.field_2._M_allocated_capacity * 0x60;
  rxEndpoint.impl_.data_.v6.sin6_scope_id = *(uint32_t *)(lVar1 + 0x18 + lVar3);
  rxEndpoint.impl_.data_._16_8_ = *(undefined8 *)(lVar1 + 0x10 + lVar3);
  rxEndpoint.impl_.data_._0_8_ = *(undefined8 *)(lVar1 + lVar3);
  rxEndpoint.impl_.data_.v4.sin_zero = *(uchar (*) [8])((undefined8 *)(lVar1 + lVar3) + 1);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1a8._M_string_length);
  asio::ip::basic_resolver_query<asio::ip::udp>::~basic_resolver_query
            ((basic_resolver_query<asio::ip::udp> *)&transmitter);
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::udp>,_asio::any_io_executor>
  ::~io_object_impl((io_object_impl<asio::detail::resolver_service<asio::ip::udp>,_asio::any_io_executor>
                     *)&cls);
  cls._M_dataplus._M_p._0_2_ = 2;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) {
    cls._M_dataplus._M_p._0_2_ = 10;
  }
  cls.field_2._8_4_ = 0;
  cls.field_2._M_allocated_capacity = 0;
  cls._M_string_length = 0;
  cls._M_dataplus._M_p._2_2_ = 0;
  cls._M_dataplus._M_p._4_4_ = 0;
  asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::basic_socket<asio::io_context>
            (&transmitter.super_basic_socket<asio::ip::udp,_asio::any_io_executor>,
             ((serv.
               super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->ictx)._M_t.
             super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
             super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
             super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,(endpoint_type *)&cls,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cls,"close",(allocator<char> *)&local_1a8);
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  local_1a8._M_dataplus._M_p = (pointer)cls._M_string_length;
  if (cls._M_string_length != 0) {
    local_1a8._M_dataplus._M_p =
         (pointer)CONCAT44(cls._M_dataplus._M_p._4_4_,
                           CONCAT22(cls._M_dataplus._M_p._2_2_,cls._M_dataplus._M_p._0_2_));
  }
  local_1a8._M_string_length = cls._M_string_length;
  asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
  send_to<asio::mutable_buffers_1>
            (&transmitter,(mutable_buffers_1 *)&local_1a8,&rxEndpoint,0,&error);
  if (error._M_value != 0) {
    (**(code **)(*(long *)error._M_cat + 0x20))(&local_148);
    local_d8 = CONCAT44(local_148._M_dataplus._M_p._4_4_,(int)local_148._M_dataplus._M_p);
    _Stack_d0._M_t.
    super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>.
    super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl =
         (tuple<asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>)
         (tuple<asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>)
         local_148._M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x21;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_d8;
    ::fmt::v11::vformat_abi_cxx11_(&local_1a8,(v11 *)"transmit failure on disconnect:{}",fmt,args);
    message._M_str = local_1a8._M_dataplus._M_p;
    message._M_len = local_1a8._M_string_length;
    CommsInterface::logWarning((CommsInterface *)this,message);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_148);
  }
  std::__cxx11::string::~string((string *)&cls);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
  ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
                   *)&transmitter);
LAB_0020b310:
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &serv.
              super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void UdpComms::closeReceiver()
{
    if (getTxStatus() == ConnectionStatus::CONNECTED) {
        ActionMessage cmd(CMD_PROTOCOL);
        cmd.messageID = CLOSE_RECEIVER;
        transmit(control_route, cmd);
    } else if (!disconnecting) {
        try {
            auto serv = gmlc::networking::AsioContextManager::getContextPointer();
            if (serv) {
                udp::endpoint rxEndpoint;

                if (localTargetAddress.empty() || localTargetAddress == "*" ||
                    localTargetAddress == "udp://*") {
                    // try connecting with the receiver socket
                    udp::resolver resolver(serv->getBaseContext());
                    const udp::resolver::query queryLocal(udpnet(interfaceNetwork),
                                                          "127.0.0.1",
                                                          std::to_string(PortNumber));
                    rxEndpoint = *resolver.resolve(queryLocal);
                } else {
                    // try connecting with the receiver socket
                    udp::resolver resolver(serv->getBaseContext());
                    const udp::resolver::query queryLocal(udpnet(interfaceNetwork),
                                                          localTargetAddress,
                                                          std::to_string(PortNumber));
                    rxEndpoint = *resolver.resolve(queryLocal);
                }

                udp::socket transmitter(serv->getBaseContext(),
                                        udp::endpoint(udpnet(interfaceNetwork), 0));
                std::string cls("close");
                std::error_code error;
                transmitter.send_to(asio::buffer(cls), rxEndpoint, 0, error);
                if (error) {
                    logWarning(fmt::format("transmit failure on disconnect:{}", error.message()));
                }
            }
        }
        // NOLINTNEXTLINE
        catch (...) {
            // ignore error here since we are already disconnecting
        }
    }
}